

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O0

unique_ptr<charls::process_line,_std::default_delete<charls::process_line>_> __thiscall
charls::jls_codec<charls::lossless_traits<unsigned_char,_8>,_charls::decoder_strategy>::
create_process_line(jls_codec<charls::lossless_traits<unsigned_char,_8>,_charls::decoder_strategy>
                    *this,byte_span info,size_t stride)

{
  color_transformation cVar1;
  bool bVar2;
  frame_info *pfVar3;
  coding_parameters *pcVar4;
  coding_parameters *pcVar5;
  jls_codec<charls::lossless_traits<unsigned_char,_8>,_charls::decoder_strategy> *this_00;
  byte_span local_88;
  byte_span local_78;
  byte_span local_68;
  byte_span local_58;
  unique_ptr<charls::post_process_single_component_masked,_std::default_delete<charls::post_process_single_component_masked>_>
  local_48;
  undefined8 local_40;
  unique_ptr<charls::post_process_single_component,_std::default_delete<charls::post_process_single_component>_>
  local_38;
  undefined1 local_30 [8];
  size_t stride_local;
  jls_codec<charls::lossless_traits<unsigned_char,_8>,_charls::decoder_strategy> *this_local;
  byte_span info_local;
  
  this_local = (jls_codec<charls::lossless_traits<unsigned_char,_8>,_charls::decoder_strategy> *)
               info.size;
  this_00 = (jls_codec<charls::lossless_traits<unsigned_char,_8>,_charls::decoder_strategy> *)
            info.data;
  stride_local = (size_t)this_00;
  info_local.data = (uint8_t *)stride;
  info_local.size = (size_t)this;
  bVar2 = is_interleaved(this_00);
  if (bVar2) {
    pcVar4 = parameters(this_00);
    if (pcVar4->transformation == None) {
      pcVar4 = (coding_parameters *)frame_info(this_00);
      pcVar5 = parameters(this_00);
      std::
      make_unique<charls::process_transformed<charls::transform_none<unsigned_char>>,charls::byte_span&,unsigned_long_const&,charls_frame_info_const&,charls::coding_parameters_const&,charls::transform_none<unsigned_char>>
                (&local_58,(unsigned_long *)&this_local,(charls_frame_info *)local_30,pcVar4,
                 (transform_none<unsigned_char> *)pcVar5);
      std::unique_ptr<charls::process_line,std::default_delete<charls::process_line>>::
      unique_ptr<charls::process_transformed<charls::transform_none<unsigned_char>>,std::default_delete<charls::process_transformed<charls::transform_none<unsigned_char>>>,void>
                ((unique_ptr<charls::process_line,std::default_delete<charls::process_line>> *)this,
                 (unique_ptr<charls::process_transformed<charls::transform_none<unsigned_char>_>,_std::default_delete<charls::process_transformed<charls::transform_none<unsigned_char>_>_>_>
                  *)&local_58);
      std::
      unique_ptr<charls::process_transformed<charls::transform_none<unsigned_char>_>,_std::default_delete<charls::process_transformed<charls::transform_none<unsigned_char>_>_>_>
      ::~unique_ptr((unique_ptr<charls::process_transformed<charls::transform_none<unsigned_char>_>,_std::default_delete<charls::process_transformed<charls::transform_none<unsigned_char>_>_>_>
                     *)&local_58);
    }
    else {
      pfVar3 = frame_info(this_00);
      if (pfVar3->bits_per_sample != 8) {
        impl::throw_jpegls_error(bit_depth_for_transform_not_supported);
      }
      pcVar4 = parameters(this_00);
      cVar1 = pcVar4->transformation;
      if (cVar1 == HP1) {
        pcVar4 = (coding_parameters *)frame_info(this_00);
        pcVar5 = parameters(this_00);
        std::
        make_unique<charls::process_transformed<charls::transform_hp1<unsigned_char>>,charls::byte_span&,unsigned_long_const&,charls_frame_info_const&,charls::coding_parameters_const&,charls::transform_hp1<unsigned_char>>
                  (&local_68,(unsigned_long *)&this_local,(charls_frame_info *)local_30,pcVar4,
                   (transform_hp1<unsigned_char> *)pcVar5);
        std::unique_ptr<charls::process_line,std::default_delete<charls::process_line>>::
        unique_ptr<charls::process_transformed<charls::transform_hp1<unsigned_char>>,std::default_delete<charls::process_transformed<charls::transform_hp1<unsigned_char>>>,void>
                  ((unique_ptr<charls::process_line,std::default_delete<charls::process_line>> *)
                   this,(unique_ptr<charls::process_transformed<charls::transform_hp1<unsigned_char>_>,_std::default_delete<charls::process_transformed<charls::transform_hp1<unsigned_char>_>_>_>
                         *)&local_68);
        std::
        unique_ptr<charls::process_transformed<charls::transform_hp1<unsigned_char>_>,_std::default_delete<charls::process_transformed<charls::transform_hp1<unsigned_char>_>_>_>
        ::~unique_ptr((unique_ptr<charls::process_transformed<charls::transform_hp1<unsigned_char>_>,_std::default_delete<charls::process_transformed<charls::transform_hp1<unsigned_char>_>_>_>
                       *)&local_68);
      }
      else if (cVar1 == HP2) {
        pcVar4 = (coding_parameters *)frame_info(this_00);
        pcVar5 = parameters(this_00);
        std::
        make_unique<charls::process_transformed<charls::transform_hp2<unsigned_char>>,charls::byte_span&,unsigned_long_const&,charls_frame_info_const&,charls::coding_parameters_const&,charls::transform_hp2<unsigned_char>>
                  (&local_78,(unsigned_long *)&this_local,(charls_frame_info *)local_30,pcVar4,
                   (transform_hp2<unsigned_char> *)pcVar5);
        std::unique_ptr<charls::process_line,std::default_delete<charls::process_line>>::
        unique_ptr<charls::process_transformed<charls::transform_hp2<unsigned_char>>,std::default_delete<charls::process_transformed<charls::transform_hp2<unsigned_char>>>,void>
                  ((unique_ptr<charls::process_line,std::default_delete<charls::process_line>> *)
                   this,(unique_ptr<charls::process_transformed<charls::transform_hp2<unsigned_char>_>,_std::default_delete<charls::process_transformed<charls::transform_hp2<unsigned_char>_>_>_>
                         *)&local_78);
        std::
        unique_ptr<charls::process_transformed<charls::transform_hp2<unsigned_char>_>,_std::default_delete<charls::process_transformed<charls::transform_hp2<unsigned_char>_>_>_>
        ::~unique_ptr((unique_ptr<charls::process_transformed<charls::transform_hp2<unsigned_char>_>,_std::default_delete<charls::process_transformed<charls::transform_hp2<unsigned_char>_>_>_>
                       *)&local_78);
      }
      else {
        if (cVar1 != HP3) {
          impl::throw_jpegls_error(UnsupportedColorTransform);
        }
        pcVar4 = (coding_parameters *)frame_info(this_00);
        pcVar5 = parameters(this_00);
        std::
        make_unique<charls::process_transformed<charls::transform_hp3<unsigned_char>>,charls::byte_span&,unsigned_long_const&,charls_frame_info_const&,charls::coding_parameters_const&,charls::transform_hp3<unsigned_char>>
                  (&local_88,(unsigned_long *)&this_local,(charls_frame_info *)local_30,pcVar4,
                   (transform_hp3<unsigned_char> *)pcVar5);
        std::unique_ptr<charls::process_line,std::default_delete<charls::process_line>>::
        unique_ptr<charls::process_transformed<charls::transform_hp3<unsigned_char>>,std::default_delete<charls::process_transformed<charls::transform_hp3<unsigned_char>>>,void>
                  ((unique_ptr<charls::process_line,std::default_delete<charls::process_line>> *)
                   this,(unique_ptr<charls::process_transformed<charls::transform_hp3<unsigned_char>_>,_std::default_delete<charls::process_transformed<charls::transform_hp3<unsigned_char>_>_>_>
                         *)&local_88);
        std::
        unique_ptr<charls::process_transformed<charls::transform_hp3<unsigned_char>_>,_std::default_delete<charls::process_transformed<charls::transform_hp3<unsigned_char>_>_>_>
        ::~unique_ptr((unique_ptr<charls::process_transformed<charls::transform_hp3<unsigned_char>_>,_std::default_delete<charls::process_transformed<charls::transform_hp3<unsigned_char>_>_>_>
                       *)&local_88);
      }
    }
  }
  else {
    pfVar3 = frame_info(this_00);
    if (pfVar3->bits_per_sample == 8) {
      local_40 = 1;
      std::
      make_unique<charls::post_process_single_component,unsigned_char*&,unsigned_long_const&,unsigned_long>
                ((uchar **)&local_38,(unsigned_long *)&this_local,(unsigned_long *)local_30);
      std::unique_ptr<charls::process_line,std::default_delete<charls::process_line>>::
      unique_ptr<charls::post_process_single_component,std::default_delete<charls::post_process_single_component>,void>
                ((unique_ptr<charls::process_line,std::default_delete<charls::process_line>> *)this,
                 &local_38);
      std::
      unique_ptr<charls::post_process_single_component,_std::default_delete<charls::post_process_single_component>_>
      ::~unique_ptr(&local_38);
    }
    else {
      local_58.size = 1;
      frame_info(this_00);
      std::
      make_unique<charls::post_process_single_component_masked,unsigned_char*&,unsigned_long_const&,unsigned_long,int_const&>
                ((uchar **)&local_48,(unsigned_long *)&this_local,(unsigned_long *)local_30,
                 (int *)&local_58.size);
      std::unique_ptr<charls::process_line,std::default_delete<charls::process_line>>::
      unique_ptr<charls::post_process_single_component_masked,std::default_delete<charls::post_process_single_component_masked>,void>
                ((unique_ptr<charls::process_line,std::default_delete<charls::process_line>> *)this,
                 &local_48);
      std::
      unique_ptr<charls::post_process_single_component_masked,_std::default_delete<charls::post_process_single_component_masked>_>
      ::~unique_ptr(&local_48);
    }
  }
  return (__uniq_ptr_data<charls::process_line,_std::default_delete<charls::process_line>,_true,_true>
          )(__uniq_ptr_data<charls::process_line,_std::default_delete<charls::process_line>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<process_line> create_process_line(byte_span info, const size_t stride) override
    {
        if (!is_interleaved())
        {
            if (frame_info().bits_per_sample == sizeof(sample_type) * 8)
            {
                return std::make_unique<post_process_single_component>(info.data, stride,
                                                                       sizeof(typename Traits::pixel_type));
            }

            return std::make_unique<post_process_single_component_masked>(
                info.data, stride, sizeof(typename Traits::pixel_type), frame_info().bits_per_sample);
        }

        if (parameters().transformation == color_transformation::none)
            return std::make_unique<process_transformed<transform_none<typename Traits::sample_type>>>(
                info, stride, frame_info(), parameters(), transform_none<sample_type>());

        if (frame_info().bits_per_sample == sizeof(sample_type) * 8)
        {
            switch (parameters().transformation)
            {
            case color_transformation::hp1:
                return std::make_unique<process_transformed<transform_hp1<sample_type>>>(
                    info, stride, frame_info(), parameters(), transform_hp1<sample_type>());
            case color_transformation::hp2:
                return std::make_unique<process_transformed<transform_hp2<sample_type>>>(
                    info, stride, frame_info(), parameters(), transform_hp2<sample_type>());
            case color_transformation::hp3:
                return std::make_unique<process_transformed<transform_hp3<sample_type>>>(
                    info, stride, frame_info(), parameters(), transform_hp3<sample_type>());
            default:
                impl::throw_jpegls_error(jpegls_errc::color_transform_not_supported);
            }
        }

        impl::throw_jpegls_error(jpegls_errc::bit_depth_for_transform_not_supported);
    }